

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

void Gia_ManResubTest(Gia_Man_t *p)

{
  void *__ptr;
  int iVar1;
  Gia_Man_t *p_00;
  Vec_Wec_t *vMffcs;
  long lVar2;
  int level;
  long lVar3;
  long lVar4;
  timespec ts;
  timespec local_38;
  
  p_00 = Gia_ManDupMuxes(p,2);
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  vMffcs = Gia_ManComputeMffcs(p_00,4,100,8,100);
  Gia_ManAddDivisors(p_00,vMffcs);
  if (0 < vMffcs->nCap) {
    lVar3 = 8;
    lVar4 = 0;
    do {
      __ptr = *(void **)((long)&vMffcs->pArray->nCap + lVar3);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&vMffcs->pArray->nCap + lVar3) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar4 < vMffcs->nCap);
  }
  if (vMffcs->pArray != (Vec_Int_t *)0x0) {
    free(vMffcs->pArray);
    vMffcs->pArray = (Vec_Int_t *)0x0;
  }
  vMffcs->nCap = 0;
  vMffcs->nSize = 0;
  free(vMffcs);
  level = 3;
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
  Gia_ManStop(p_00);
  return;
}

Assistant:

void Gia_ManResubTest( Gia_Man_t * p )
{
    Vec_Wec_t * vMffcs;
    Gia_Man_t * pNew = Gia_ManDupMuxes( p, 2 );
abctime clkStart = Abc_Clock();
    vMffcs = Gia_ManComputeMffcs( pNew, 4, 100, 8, 100 );
    Gia_ManAddDivisors( pNew, vMffcs );
    Vec_WecFree( vMffcs );
Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    Gia_ManStop( pNew );
}